

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_get_html_translation_table(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  char *zKey;
  jx9_value *pVal;
  jx9_value *pArray;
  ulong uVar2;
  
  pVal = jx9_context_new_scalar(pCtx);
  if ((pVal != (jx9_value *)0x0) &&
     (pArray = jx9_context_new_array(pCtx), pArray != (jx9_value *)0x0)) {
    uVar2 = 0xfffffffffffffffe;
    do {
      zKey = azHtmlEscape[uVar2 + 3];
      jx9_value_string(pVal,azHtmlEscape[uVar2 + 2],-1);
      jx9_array_add_strkey_elem(pArray,zKey,pVal);
      (pVal->sBlob).nByte = 0;
      uVar1 = (pVal->sBlob).nFlags;
      if ((uVar1 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        (pVal->sBlob).nFlags = uVar1 & 0xfffffffb;
      }
      uVar2 = uVar2 + 2;
    } while (uVar2 < 0x26);
    jx9MemObjStore(pArray,pCtx->pRet);
    return 0;
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int jx9Builtin_get_html_translation_table(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray, *pValue;
	sxu32 n;
	/* Element value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make the table */
	for( n = 0 ; n < SX_ARRAYSIZE(azHtmlEscape) ; n += 2 ){
		/* Prepare the value */
		jx9_value_string(pValue, azHtmlEscape[n], -1 /* Compute length automatically */);
		/* Insert the value */
		jx9_array_add_strkey_elem(pArray, azHtmlEscape[n+1], pValue);
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
	}
	/* 
	 * Return the array.
	 * Don't worry about freeing memory, everything will be automatically
	 * released upon we return from this function.
	 */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}